

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue::~IfcPropertyReferenceValue
          (IfcPropertyReferenceValue *this)

{
  undefined1 *puVar1;
  
  *(undefined ***)&this[-1].field_0x60 = &PTR__IfcPropertyReferenceValue_0089cbc8;
  *(undefined ***)&this->field_0x48 = &PTR__IfcPropertyReferenceValue_0089cc40;
  *(undefined ***)&this[-1].field_0xb8 = &PTR__IfcPropertyReferenceValue_0089cbf0;
  *(undefined ***)this = &PTR__IfcPropertyReferenceValue_0089cc18;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x40 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x40);
  }
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  *(undefined8 *)&this[-1].field_0x60 = 0x89cd58;
  *(undefined8 *)&this->field_0x48 = 0x89cd80;
  if ((Out *)*(undefined1 **)&this[-1].field_0x90 != &this[-1].PropertyReference) {
    operator_delete(*(undefined1 **)&this[-1].field_0x90);
  }
  puVar1 = (undefined1 *)
           this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>.
           aux_is_derived.super__Base_bitset<1UL>._M_w;
  if (puVar1 != &this[-1].
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPropertyReferenceValue,_2UL>.
                 field_0x18) {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].field_0x60);
  return;
}

Assistant:

IfcPropertyReferenceValue() : Object("IfcPropertyReferenceValue") {}